

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O2

Expression * __thiscall MathInterpreter::fromStringToExpression(MathInterpreter *this)

{
  bool bVar1;
  Variable *this_00;
  iterator iVar2;
  mapped_type *ppVVar3;
  Expression *pEVar4;
  undefined **ppuVar5;
  Expression *pEVar6;
  undefined8 *puVar7;
  MathInterpreter *pMVar8;
  pointer pcVar9;
  double value_arg;
  MathInterpreter local_a0;
  MathInterpreter local_80;
  string local_60;
  undefined1 local_40 [8];
  string temp;
  
  local_40 = (undefined1  [8])&temp._M_string_length;
  temp._M_dataplus._M_p = (pointer)0x0;
  temp._M_string_length._0_1_ = 0;
  std::__cxx11::string::_M_assign((string *)local_40);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(this->postfix_expression);
  pMVar8 = &local_a0;
  std::__cxx11::string::string((string *)pMVar8,(string *)local_40);
  bVar1 = isNumber(pMVar8,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (bVar1) {
    this_00 = (Variable *)operator_new(0x10);
    pcVar9 = (pointer)atof((char *)local_40);
    (this_00->super_Expression)._vptr_Expression = (_func_int **)&PTR_calculate_00114a78;
    (this_00->name)._M_dataplus._M_p = pcVar9;
  }
  else {
    pMVar8 = &local_80;
    std::__cxx11::string::string((string *)pMVar8,(string *)local_40);
    bVar1 = isVariable(pMVar8,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (bVar1) {
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
              ::find(&this->variables->_M_t,(key_type *)local_40);
      if ((_Rb_tree_header *)iVar2._M_node == &(this->variables->_M_t)._M_impl.super__Rb_tree_header
         ) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = "illegal use of variable!";
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
      this_00 = (Variable *)operator_new(0x70);
      std::__cxx11::string::string((string *)&local_60,(string *)local_40);
      ppVVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
                ::at(this->variables,(key_type *)local_40);
      (**((*ppVVar3)->super_Expression)._vptr_Expression)();
      Variable::Variable(this_00,&local_60,value_arg);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"@");
      if (bVar1) {
        this_00 = (Variable *)operator_new(0x10);
        pEVar4 = fromStringToExpression(this);
        (this_00->name)._M_dataplus._M_p = (pointer)pEVar4;
        ppuVar5 = &PTR_calculate_00114c30;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"$");
        if (bVar1) {
          this_00 = (Variable *)operator_new(0x10);
          pEVar4 = fromStringToExpression(this);
          (this_00->name)._M_dataplus._M_p = (pointer)pEVar4;
          ppuVar5 = &PTR_calculate_00114c88;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"+");
          if (bVar1) {
            pEVar4 = fromStringToExpression(this);
            pEVar6 = fromStringToExpression(this);
            this_00 = (Variable *)operator_new(0x18);
            (this_00->name)._M_dataplus._M_p = (pointer)pEVar6;
            (this_00->name)._M_string_length = (size_type)pEVar4;
            ppuVar5 = &PTR_calculate_00114b18;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"-");
            if (bVar1) {
              pEVar4 = fromStringToExpression(this);
              pEVar6 = fromStringToExpression(this);
              this_00 = (Variable *)operator_new(0x18);
              (this_00->name)._M_dataplus._M_p = (pointer)pEVar6;
              (this_00->name)._M_string_length = (size_type)pEVar4;
              ppuVar5 = &PTR_calculate_00114b70;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"*");
              if (bVar1) {
                pEVar4 = fromStringToExpression(this);
                pEVar6 = fromStringToExpression(this);
                this_00 = (Variable *)operator_new(0x18);
                (this_00->name)._M_dataplus._M_p = (pointer)pEVar6;
                (this_00->name)._M_string_length = (size_type)pEVar4;
                ppuVar5 = &PTR_calculate_00114bb0;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_40,"/");
                if (!bVar1) {
                  this_00 = (Variable *)0x0;
                  goto LAB_0010c256;
                }
                pEVar4 = fromStringToExpression(this);
                pEVar6 = fromStringToExpression(this);
                this_00 = (Variable *)operator_new(0x18);
                (this_00->name)._M_dataplus._M_p = (pointer)pEVar6;
                (this_00->name)._M_string_length = (size_type)pEVar4;
                ppuVar5 = &PTR_calculate_00114bf0;
              }
            }
          }
        }
      }
      (this_00->super_Expression)._vptr_Expression = (_func_int **)ppuVar5;
    }
  }
LAB_0010c256:
  std::__cxx11::string::~string((string *)local_40);
  return &this_00->super_Expression;
}

Assistant:

Expression *MathInterpreter::fromStringToExpression() {
  string temp;
  Expression *right, *left;
  temp = this->postfix_expression->back();
  this->postfix_expression->pop_back();
  if (isNumber(temp)) {
    return new Value(atof(temp.c_str()));
  } else if (isVariable(temp)) {
    if (this->variables->find(temp) == this->variables->end()) {
      throw ("illegal use of variable!");
    }
    return new Variable(temp, this->variables->at(temp)->calculate());
  } else if (temp == "@") {
    return new UPlus(fromStringToExpression());
  } else if (temp == "$") {
    return new UMinus(fromStringToExpression());
  } else if (temp == "+") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Plus(left, right);
  } else if (temp == "-") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Minus(left, right);
  } else if (temp == "*") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Mul(left, right);
  } else if (temp == "/") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Div(left, right);
  }
  return nullptr;
}